

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3MutexInit(void)

{
  int iVar1;
  sqlite3_mutex_methods *pTo;
  sqlite3_mutex_methods *pFrom;
  int rc;
  
  if (sqlite3Config.mutex.xMutexAlloc == (_func_sqlite3_mutex_ptr_int *)0x0) {
    if (sqlite3Config.bCoreMutex == '\0') {
      pTo = sqlite3NoopMutex();
    }
    else {
      pTo = sqlite3DefaultMutex();
    }
    sqlite3Config.mutex.xMutexInit = pTo->xMutexInit;
    sqlite3Config.mutex.xMutexEnd = pTo->xMutexEnd;
    sqlite3Config.mutex.xMutexFree = pTo->xMutexFree;
    sqlite3Config.mutex.xMutexEnter = pTo->xMutexEnter;
    sqlite3Config.mutex.xMutexTry = pTo->xMutexTry;
    sqlite3Config.mutex.xMutexLeave = pTo->xMutexLeave;
    sqlite3Config.mutex.xMutexHeld = pTo->xMutexHeld;
    sqlite3Config.mutex.xMutexNotheld = pTo->xMutexNotheld;
    sqlite3MemoryBarrier();
    sqlite3Config.mutex.xMutexAlloc = pTo->xMutexAlloc;
  }
  iVar1 = (*sqlite3Config.mutex.xMutexInit)();
  sqlite3MemoryBarrier();
  return iVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3MutexInit(void){
  int rc = SQLITE_OK;
  if( !sqlite3GlobalConfig.mutex.xMutexAlloc ){
    /* If the xMutexAlloc method has not been set, then the user did not
    ** install a mutex implementation via sqlite3_config() prior to
    ** sqlite3_initialize() being called. This block copies pointers to
    ** the default implementation into the sqlite3GlobalConfig structure.
    */
    sqlite3_mutex_methods const *pFrom;
    sqlite3_mutex_methods *pTo = &sqlite3GlobalConfig.mutex;

    if( sqlite3GlobalConfig.bCoreMutex ){
#ifdef SQLITE_ENABLE_MULTITHREADED_CHECKS
      pFrom = multiThreadedCheckMutex();
#else
      pFrom = sqlite3DefaultMutex();
#endif
    }else{
      pFrom = sqlite3NoopMutex();
    }
    pTo->xMutexInit = pFrom->xMutexInit;
    pTo->xMutexEnd = pFrom->xMutexEnd;
    pTo->xMutexFree = pFrom->xMutexFree;
    pTo->xMutexEnter = pFrom->xMutexEnter;
    pTo->xMutexTry = pFrom->xMutexTry;
    pTo->xMutexLeave = pFrom->xMutexLeave;
    pTo->xMutexHeld = pFrom->xMutexHeld;
    pTo->xMutexNotheld = pFrom->xMutexNotheld;
    sqlite3MemoryBarrier();
    pTo->xMutexAlloc = pFrom->xMutexAlloc;
  }
  assert( sqlite3GlobalConfig.mutex.xMutexInit );
  rc = sqlite3GlobalConfig.mutex.xMutexInit();

#ifdef SQLITE_DEBUG
  GLOBAL(int, mutexIsInit) = 1;
#endif

  sqlite3MemoryBarrier();
  return rc;
}